

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O1

void Aig_ManCheckMarkA(Aig_Man_t *p)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)p->vObjs->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar3];
      if ((pvVar1 != (void *)0x0) && ((*(byte *)((long)pvVar1 + 0x18) & 0x10) != 0)) {
        __assert_fail("pObj->fMarkA == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCheck.c"
                      ,0x89,"void Aig_ManCheckMarkA(Aig_Man_t *)");
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return;
}

Assistant:

void Aig_ManCheckMarkA( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        assert( pObj->fMarkA == 0 );
}